

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(uint edge_id,ON_SubDEdgeTag etag)

{
  ON_SubD_ComponentIdTypeAndTag OVar1;
  ON_SubDEdgeTag local_1e;
  undefined1 auStack_18 [3];
  ON_SubDEdgeTag etag_local;
  uint edge_id_local;
  ON_SubD_ComponentIdTypeAndTag itt;
  
  ON_SubD_ComponentIdTypeAndTag((ON_SubD_ComponentIdTypeAndTag *)auStack_18);
  if (edge_id != 0) {
    _auStack_18 = (ON_SubDEdgeSharpness)(float  [2])0x0;
    itt.m_sharpness.m_edge_sharpness[1] =
         (float)CONCAT31(itt.m_sharpness.m_edge_sharpness[1]._1_3_,4);
    local_1e = etag;
    if (etag == SmoothX) {
      local_1e = Smooth;
    }
    itt.m_sharpness.m_edge_sharpness[0] = (float)edge_id;
    Internal_SetTag((ON_SubD_ComponentIdTypeAndTag *)auStack_18,local_1e);
  }
  OVar1.m_id = (uint)itt.m_sharpness.m_edge_sharpness[0];
  OVar1.m_sharpness.m_edge_sharpness[0] = _auStack_18;
  OVar1.m_sharpness.m_edge_sharpness[1] = (float)edge_id_local;
  OVar1._12_4_ = itt.m_sharpness.m_edge_sharpness[1];
  return OVar1;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(unsigned edge_id, ON_SubDEdgeTag etag)
{
  ON_SubD_ComponentIdTypeAndTag itt;
  if (edge_id > 0)
  {
    itt.m_sharpness = ON_SubDEdgeSharpness::Smooth;
    itt.m_id = edge_id;
    itt.m_type = ON_SubDComponentPtr::Type::Edge;
    itt.Internal_SetTag(static_cast<unsigned char>(ON_SubDEdgeTag::SmoothX == etag ? ON_SubDEdgeTag::Smooth : etag));
  }
  return itt;
}